

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gopher.c
# Opt level: O2

CURLcode gopher_connecting(Curl_easy *data,_Bool *done)

{
  connectdata *conn;
  CURLcode CVar1;
  
  conn = data->conn;
  CVar1 = Curl_conn_connect(data,0,true,done);
  if (CVar1 != CURLE_OK) {
    Curl_conncontrol(conn,1);
  }
  *done = true;
  return CVar1;
}

Assistant:

static CURLcode gopher_connecting(struct Curl_easy *data, bool *done)
{
  struct connectdata *conn = data->conn;
  CURLcode result;

  result = Curl_conn_connect(data, FIRSTSOCKET, TRUE, done);
  if(result)
    connclose(conn, "Failed TLS connection");
  *done = TRUE;
  return result;
}